

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_tools.cc
# Opt level: O0

void core::image::gamma_correct(Ptr *image,float power)

{
  uchar uVar1;
  bool bVar2;
  int iVar3;
  invalid_argument *this;
  TypedImageBase<unsigned_char> *this_00;
  element_type *peVar4;
  byte *pbVar5;
  uchar *puVar6;
  undefined4 extraout_XMM0_Db;
  double dVar7;
  undefined4 uVar8;
  int local_130;
  int local_12c;
  int i_1;
  int i;
  uint8_t lookup [256];
  float power_local;
  Ptr *image_local;
  
  bVar2 = std::operator==(image,(nullptr_t)0x0);
  if (!bVar2) {
    uVar8 = extraout_XMM0_Db;
    for (local_12c = 0; local_12c < 0x100; local_12c = local_12c + 1) {
      dVar7 = std::pow((double)CONCAT44(uVar8,(float)local_12c / 255.0),(double)(ulong)(uint)power);
      uVar8 = (undefined4)((ulong)dVar7 >> 0x20);
      *(char *)((long)&i_1 + (long)local_12c) = (char)(int)(SUB84(dVar7,0) * 255.0 + 0.5);
    }
    local_130 = 0;
    while( true ) {
      this_00 = &std::
                 __shared_ptr_access<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)image)->super_TypedImageBase<unsigned_char>;
      iVar3 = TypedImageBase<unsigned_char>::get_value_amount(this_00);
      if (iVar3 <= local_130) break;
      peVar4 = std::
               __shared_ptr_access<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)image);
      pbVar5 = Image<unsigned_char>::at(peVar4,local_130);
      uVar1 = *(uchar *)((long)&i_1 + (ulong)*pbVar5);
      peVar4 = std::
               __shared_ptr_access<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)image);
      puVar6 = Image<unsigned_char>::at(peVar4,local_130);
      *puVar6 = uVar1;
      local_130 = local_130 + 1;
    }
    return;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"Null image given");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void
gamma_correct (ByteImage::Ptr image, float power)
{
    if (image == nullptr)
        throw std::invalid_argument("Null image given");

    uint8_t lookup[256];
    for (int i = 0; i < 256; ++i)
        lookup[i] = static_cast<uint8_t>(std::pow(i / 255.0f, power)
            * 255.0f + 0.5f);
    for (int i = 0; i < image->get_value_amount(); ++i)
        image->at(i) = lookup[image->at(i)];
}